

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O1

void __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::set_addr_align
          (section_impl<ELFIO::Elf64_Shdr> *this,Elf_Xword value)

{
  ulong uVar1;
  
  uVar1 = value >> 0x38 | (value & 0xff000000000000) >> 0x28 | (value & 0xff0000000000) >> 0x18 |
          (value & 0xff00000000) >> 8 | (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 |
          (value & 0xff00) << 0x28 | value << 0x38;
  if ((this->convertor).need_conversion == false) {
    uVar1 = value;
  }
  (this->header).sh_addralign = uVar1;
  return;
}

Assistant:

uint64_t
    operator()( uint64_t value ) const
    {
        if ( !need_conversion ) {
            return value;
        }
        value =
            ( ( value & 0x00000000000000FFull ) << 56 ) |
            ( ( value & 0x000000000000FF00ull ) << 40 ) |
            ( ( value & 0x0000000000FF0000ull ) << 24 ) |
            ( ( value & 0x00000000FF000000ull ) <<  8 ) |
            ( ( value & 0x000000FF00000000ull ) >>  8 ) |
            ( ( value & 0x0000FF0000000000ull ) >> 24 ) |
            ( ( value & 0x00FF000000000000ull ) >> 40 ) |
            ( ( value & 0xFF00000000000000ull ) >> 56 );

        return value;
    }